

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Annotation *
soul::createAnnotation
          (Annotation *__return_storage_ptr__,Annotation *a,StringDictionary *dictionary)

{
  pointer pPVar1;
  mapped_type *pmVar2;
  pointer pPVar3;
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  local_88;
  Expression local_68;
  string local_50;
  
  (__return_storage_ptr__->properties)._M_h._M_buckets =
       &(__return_storage_ptr__->properties)._M_h._M_single_bucket;
  (__return_storage_ptr__->properties)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->properties)._M_h._M_element_count = 0;
  (__return_storage_ptr__->properties)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->properties)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->properties)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pPVar3 = (a->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (a->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar3 != pPVar1) {
    do {
      ExpressionHelpers::create(&local_68,(pPVar3->value).object,dictionary);
      AST::UnqualifiedName::toString_abi_cxx11_(&local_50,(pPVar3->name).object);
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)__return_storage_ptr__,&local_50);
      local_88.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pmVar2->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pmVar2->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pmVar2->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar2->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_68.sections.
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pmVar2->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_68.sections.
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pmVar2->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_68.sections.
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.sections.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.sections.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.sections.
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_68.sections);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Annotation createAnnotation (const AST::Annotation& a, const StringDictionary& dictionary)
{
    SourceCodeModel::Annotation result;

    for (auto& p : a.properties)
        result.properties[p.name->toString()] = ExpressionHelpers::create (p.value, dictionary);

    return result;
}